

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O0

logical pnga_sprs_array_destroy(Integer s_a)

{
  long lVar1;
  logical lVar2;
  long in_RDI;
  int local_sync_end;
  int local_sync_begin;
  Integer ret;
  Integer hdl;
  int iVar3;
  int iVar4;
  ulong local_18;
  
  iVar3 = _ga_sync_end;
  iVar4 = _ga_sync_begin;
  lVar1 = in_RDI + 1000;
  local_18 = 1;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (iVar4 != 0) {
    pnga_pgroup_sync(CONCAT44(iVar4,iVar3));
  }
  if (SPA[lVar1].ready == 0) {
    if (SPA[lVar1].active != 0) {
      free(SPA[lVar1].val);
      SPA[lVar1].val = (void *)0x0;
      free(SPA[lVar1].idx);
      SPA[lVar1].idx = (Integer *)0x0;
      free(SPA[lVar1].jdx);
      SPA[lVar1].jdx = (Integer *)0x0;
    }
  }
  else {
    lVar2 = pnga_destroy(in_RDI);
    local_18 = (ulong)(lVar2 != 0);
    lVar2 = pnga_destroy(in_RDI);
    if (lVar2 == 0) {
      local_18 = 0;
    }
    lVar2 = pnga_destroy(in_RDI);
    if (lVar2 == 0) {
      local_18 = 0;
    }
    lVar2 = pnga_destroy(in_RDI);
    if (lVar2 == 0) {
      local_18 = 0;
    }
    if (SPA[lVar1].blkidx != (Integer *)0x0) {
      free(SPA[lVar1].blkidx);
      SPA[lVar1].blkidx = (Integer *)0x0;
    }
    if (SPA[lVar1].blksize != (Integer *)0x0) {
      free(SPA[lVar1].blksize);
      SPA[lVar1].blksize = (Integer *)0x0;
    }
    if (SPA[lVar1].offset != (Integer *)0x0) {
      free(SPA[lVar1].offset);
      SPA[lVar1].offset = (Integer *)0x0;
    }
  }
  SPA[lVar1].active = 0;
  SPA[lVar1].ready = 0;
  if (iVar3 != 0) {
    pnga_pgroup_sync(CONCAT44(iVar4,iVar3));
  }
  return local_18;
}

Assistant:

logical pnga_sprs_array_destroy(Integer s_a)
{
  Integer hdl = GA_OFFSET + s_a;
  Integer ret = 1;
  int local_sync_begin,local_sync_end;
  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(SPA[hdl].grp);
  if (SPA[hdl].ready) {
    if (!pnga_destroy(SPA[hdl].g_data)) ret = 0;
    if (!pnga_destroy(SPA[hdl].g_i)) ret = 0;
    if (!pnga_destroy(SPA[hdl].g_j)) ret = 0;
    if (!pnga_destroy(SPA[hdl].g_blk)) ret = 0;
    if (SPA[hdl].blkidx != NULL) {
      free(SPA[hdl].blkidx);
      SPA[hdl].blkidx = NULL;
    }
    if (SPA[hdl].blksize != NULL) {
      free(SPA[hdl].blksize);
      SPA[hdl].blksize = NULL;
    }
    if (SPA[hdl].offset != NULL) {
      free(SPA[hdl].offset);
      SPA[hdl].offset = NULL;
    }
  } else if (SPA[hdl].active) {
    free(SPA[hdl].val);
    SPA[hdl].val = NULL;
    free(SPA[hdl].idx);
    SPA[hdl].idx = NULL;
    free(SPA[hdl].jdx);
    SPA[hdl].jdx = NULL;
  }
  SPA[hdl].active = 0;
  SPA[hdl].ready = 0;
  if (local_sync_end) pnga_pgroup_sync(SPA[hdl].grp);
  return ret;
}